

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mocks.c
# Opt level: O1

Constraint * times_(int number_times_called)

{
  Constraint *pCVar1;
  char *pcVar2;
  CgreenValue local_28;
  
  pCVar1 = create_constraint();
  make_cgreen_integer_value(&local_28,(long)number_times_called);
  (pCVar1->expected_value).value_size = local_28.value_size;
  (pCVar1->expected_value).type = local_28.type;
  *(undefined4 *)&(pCVar1->expected_value).field_0x4 = local_28._4_4_;
  (pCVar1->expected_value).value = local_28.value;
  pcVar2 = string_dup("times");
  pCVar1->expected_value_name = pcVar2;
  pCVar1->type = CGREEN_CALL_COUNTER_CONSTRAINT;
  pCVar1->compare = compare_want_value;
  pCVar1->execute = test_times_called;
  pCVar1->name = "be called";
  pCVar1->size_of_expected_value = 8;
  pCVar1->expected_value_message = "\t\texpected to have been called:\t[%ld] times";
  return pCVar1;
}

Assistant:

Constraint *times_(const int number_times_called) {
    Constraint * time_constraint = create_constraint();
    time_constraint->expected_value = make_cgreen_integer_value(number_times_called);
    time_constraint->expected_value_name = string_dup("times");
    time_constraint->type = CGREEN_CALL_COUNTER_CONSTRAINT;

    time_constraint->compare = &compare_want_value;
    time_constraint->execute = &test_times_called;
    time_constraint->name = "be called";
    time_constraint->size_of_expected_value = sizeof(intptr_t);
    time_constraint->expected_value_message = "\t\texpected to have been called:\t[%" PRIdPTR "] times";
    return time_constraint;
}